

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsLaterStandard(cmMakefile *this,string *lang,string *lhs,string *rhs)

{
  bool bVar1;
  char **ppcVar2;
  string *this_00;
  string *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  cmStrCmp local_a0;
  cmStrCmp local_80;
  cmStrCmp local_60;
  cmStrCmp local_40;
  
  bVar1 = std::operator==(lang,"C");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_c0,(string *)rhs);
    local_40.m_test._M_dataplus._M_p = (pointer)&local_40.m_test.field_2;
    if (local_c0 == &local_b0) {
      local_40.m_test.field_2._8_8_ = local_b0._8_8_;
    }
    else {
      local_40.m_test._M_dataplus._M_p = (pointer)local_c0;
    }
    local_40.m_test._M_string_length = local_b8;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_c0 = &local_b0;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(C_STANDARDS,(char **)&DAT_0052d8c8,&local_40)
    ;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_e0,(string *)lhs);
    local_60.m_test._M_dataplus._M_p = (pointer)&local_60.m_test.field_2;
    if (local_e0 == &local_d0) {
      local_60.m_test.field_2._8_8_ = local_d0._8_8_;
    }
    else {
      local_60.m_test._M_dataplus._M_p = (pointer)local_e0;
    }
    local_60.m_test._M_string_length = local_d8;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_e0 = &local_d0;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,(char **)&DAT_0052d8c8,&local_60);
    bVar1 = ppcVar2 != (char **)&DAT_0052d8c8;
    this_01 = (string *)&local_e0;
    this_00 = (string *)&local_60;
  }
  else {
    std::__cxx11::string::string((string *)&local_100,(string *)rhs);
    local_80.m_test._M_dataplus._M_p = (pointer)&local_80.m_test.field_2;
    if (local_100 == &local_f0) {
      local_80.m_test.field_2._8_8_ = local_f0._8_8_;
    }
    else {
      local_80.m_test._M_dataplus._M_p = (pointer)local_100;
    }
    local_80.m_test._M_string_length = local_f8;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_100 = &local_f0;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string((string *)&local_120,(string *)lhs);
    local_a0.m_test._M_dataplus._M_p = (pointer)&local_a0.m_test.field_2;
    if (local_120 == &local_110) {
      local_a0.m_test.field_2._8_8_ = local_110._8_8_;
    }
    else {
      local_a0.m_test._M_dataplus._M_p = (pointer)local_120;
    }
    local_a0.m_test._M_string_length = local_118;
    local_118 = 0;
    local_110._M_local_buf[0] = '\0';
    local_120 = &local_110;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (ppcVar2,(char **)&cmMakefileTargetGenerator::vtable,&local_a0);
    bVar1 = ppcVar2 != (char **)&cmMakefileTargetGenerator::vtable;
    this_01 = (string *)&local_120;
    this_00 = (string *)&local_a0;
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_01);
  return bVar1;
}

Assistant:

bool cmMakefile::IsLaterStandard(std::string const& lang,
                                 std::string const& lhs,
                                 std::string const& rhs)
{
  if (lang == "C") {
    const char* const* rhsIt = std::find_if(
      cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS), cmStrCmp(rhs));

    return std::find_if(rhsIt, cm::cend(C_STANDARDS), cmStrCmp(lhs)) !=
      cm::cend(C_STANDARDS);
  }
  const char* const* rhsIt = std::find_if(
    cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS), cmStrCmp(rhs));

  return std::find_if(rhsIt, cm::cend(CXX_STANDARDS), cmStrCmp(lhs)) !=
    cm::cend(CXX_STANDARDS);
}